

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void print_fasta_seq(kseq_t *seq,int n)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *seqbuf;
  int i;
  int x;
  int l;
  int n_local;
  kseq_t *seq_local;
  
  iVar1 = (int)(seq->seq).l;
  seqbuf._0_4_ = 0;
  __s = (char *)malloc((long)(n + 1));
  if (__s != (char *)0x0) {
    x = n;
    if (n < 1) {
      x = 0x32;
    }
    if (x < iVar1) {
      if ((seq->comment).s == (char *)0x0) {
        printf(">%s\n",(seq->name).s);
      }
      else if ((seq->comment).l == 0) {
        printf(">%s\n",(seq->name).s);
      }
      else {
        printf(">%s %s\n",(seq->name).s,(seq->comment).s);
      }
      for (seqbuf._4_4_ = 0; seqbuf._4_4_ < iVar1; seqbuf._4_4_ = seqbuf._4_4_ + 1) {
        if ((int)seqbuf < x) {
          __s[(int)seqbuf] = (seq->seq).s[seqbuf._4_4_];
          seqbuf._0_4_ = (int)seqbuf + 1;
        }
        else {
          __s[(int)seqbuf] = '\0';
          printf("%s\n",__s);
          *__s = '\0';
          *__s = (seq->seq).s[seqbuf._4_4_];
          seqbuf._0_4_ = 1;
        }
      }
      if ((int)seqbuf < x) {
        __s[(int)seqbuf] = '\0';
      }
      sVar2 = strlen(__s);
      if (sVar2 != 0) {
        printf("%s\n",__s);
      }
    }
    else if ((seq->comment).l == 0) {
      printf(">%s\n%s\n",(seq->name).s,(seq->seq).s);
    }
    else {
      printf(">%s %s\n%s\n",(seq->name).s,(seq->comment).s,(seq->seq).s);
    }
    free(__s);
    return;
  }
  fprintf(_stderr,"print_seq: out of memory for seqbuf!\n");
  exit(1);
}

Assistant:

void print_fasta_seq(kseq_t *seq, int n)
{
	int l = seq->seq.l;   /* sequence length */
	int x,i=0;
	char *seqbuf = NULL;
	seqbuf = (char *)malloc(sizeof(char) * (n + 1));
	if (seqbuf == NULL) {
		fprintf(stderr,"print_seq: out of memory for seqbuf!\n");
		exit(EXIT_FAILURE);
	}

	if (n <= 0)
		n = 50;

	if (l > n) {                  /* seqlength is > column length - split sequence */
		if (seq->comment.s == NULL) {
			printf(">%s\n",seq->name.s);
		} else {
			if (seq->comment.l == 0)
				printf(">%s\n",seq->name.s);
			else
				printf(">%s %s\n",seq->name.s, seq->comment.s);
		}

		for (x=0; x<l;x++) {
			if (i < n) {                     /* there's less sequence than the column width */
				seqbuf[i] = seq->seq.s[x];
				i++;
			} else {                         /* i is >= column width, so print this line */
				seqbuf[i] = '\0';            /* set last position in string to null */
				printf("%s\n",seqbuf);       /* print this line */
				i = 0;                       /* reset i */
				seqbuf[0] = '\0';            /* reset buffer */
				seqbuf[i] = seq->seq.s[x];   /* set this buffer line to current sequence char */
				i++;
			}
		}
		if (i<n)
			seqbuf[i] = '\0';
		if (strlen(seqbuf) > 0)
			printf("%s\n",seqbuf);
	} else {                     /* seqlength < column length, so just print the full sequence */
		if (seq->comment.l == 0)
			printf(">%s\n%s\n",seq->name.s,seq->seq.s);
		else
			printf(">%s %s\n%s\n",seq->name.s,seq->comment.s,seq->seq.s);
	}
	free(seqbuf);
}